

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.hpp
# Opt level: O0

vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> * __thiscall
CompoundFile::SAT::sectors(SAT *this,SecID *firstSector)

{
  int32_t iVar1;
  size_type sVar2;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *this_00;
  wostream *this_01;
  undefined8 uVar3;
  SecID *in_RDX;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_RSI;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_RDI;
  wstringstream stream;
  SecID id;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *result;
  size_type in_stack_fffffffffffffde8;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *in_stack_fffffffffffffdf0;
  wstring *in_stack_fffffffffffffdf8;
  Exception *in_stack_fffffffffffffe00;
  wstringstream local_1b8 [16];
  wostream local_1a8 [376];
  SecID local_30 [5];
  undefined1 local_19;
  SecID *local_18;
  
  local_18 = in_RDX;
  iVar1 = SecID::operator_cast_to_int(in_RDX);
  sVar2 = std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::size(in_RSI);
  if ((int)sVar2 <= iVar1) {
    std::__cxx11::wstringstream::wstringstream(local_1b8);
    this_01 = std::operator<<(local_1a8,L"There is no such sector with id: ");
    iVar1 = SecID::operator_cast_to_int(local_18);
    std::wostream::operator<<(this_01,iVar1);
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::wstringstream::str();
    Exception::Exception(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  local_19 = 0;
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)0x10a8a5);
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::push_back
            ((vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
             in_stack_fffffffffffffe00,(value_type *)in_stack_fffffffffffffdf8);
  SecID::operator_cast_to_int(local_18);
  this_00 = (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)
            std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                      (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  local_30[0].m_id =
       *(int32_t *)
        &(this_00->super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>).
         _M_impl.super__Vector_impl_data._M_start;
  while (iVar1 = SecID::operator_cast_to_int(local_30), -1 < iVar1) {
    std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::push_back
              (this_00,(value_type *)in_stack_fffffffffffffdf8);
    SecID::operator_cast_to_int(local_30);
    in_stack_fffffffffffffdf8 =
         (wstring *)
         std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::at
                   (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
    local_30[0].m_id = *(int32_t *)in_stack_fffffffffffffdf8;
  }
  return in_RDI;
}

Assistant:

inline std::vector< SecID >
SAT::sectors( const SecID & firstSector ) const
{
	if( firstSector < static_cast< int32_t > ( m_sat.size() ) )
	{
		std::vector< SecID > result;

		result.push_back( firstSector );

		SecID id = m_sat.at( firstSector );

		while( true )
		{
			if( id >= 0 )
				result.push_back( id );
			else
				break;

			id = m_sat.at( id );
		}

		return result;
	}
	else
	{
		std::wstringstream stream;
		stream << L"There is no such sector with id: " << firstSector;

		throw Exception( stream.str() );
	}
}